

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O0

bool XYZ2NEU(XYZ station,XYZ obj,ELLIPSOID type,XYZ *neu)

{
  code *pcVar1;
  XYZ xyz;
  ELLIPSOID ellipsoid;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 local_b0 [8];
  Vector3d result;
  Vector3d vec;
  Matrix3d rotation;
  double L;
  double B;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  double local_30;
  undefined1 local_28 [8];
  BLH station_blh;
  XYZ *neu_local;
  
  station_blh.H = (double)neu;
  BLH::BLH((BLH *)local_28);
  local_40 = station.X;
  dStack_38 = station.Y;
  local_30 = station.Z;
  memcpy(&B,&type,0x30);
  xyz.Y = dStack_38;
  xyz.X = local_40;
  xyz.Z = local_30;
  ellipsoid.b = (double)uStack_68;
  ellipsoid.a = B;
  ellipsoid.c = (double)local_60;
  ellipsoid.alpha = (double)uStack_58;
  ellipsoid.e2 = (double)local_50;
  ellipsoid.e1_2 = dStack_48;
  XYZ2BLH(xyz,ellipsoid,(BLH *)local_28);
  dVar3 = Deg2Rad((double)local_28);
  dVar4 = Deg2Rad(station_blh.B);
  Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&vec.data);
  dVar5 = sin(dVar3);
  dVar6 = cos(dVar4);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,0,0);
  *pdVar2 = -dVar5 * dVar6;
  dVar5 = sin(dVar3);
  dVar6 = sin(dVar4);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,0,1);
  *pdVar2 = -dVar5 * dVar6;
  dVar5 = cos(dVar3);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,0,2);
  *pdVar2 = dVar5;
  dVar5 = sin(dVar4);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,1,0);
  *pdVar2 = -dVar5;
  dVar5 = cos(dVar4);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,1,1);
  *pdVar2 = dVar5;
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,1,2);
  *pdVar2 = 0.0;
  dVar5 = cos(dVar3);
  dVar6 = cos(dVar4);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,2,0);
  *pdVar2 = dVar5 * dVar6;
  dVar5 = cos(dVar3);
  dVar4 = sin(dVar4);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,2,1);
  *pdVar2 = dVar5 * dVar4;
  dVar3 = sin(dVar3);
  pdVar2 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&vec.data,2,2);
  *pdVar2 = dVar3;
  Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)&result.data);
  pdVar2 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&result.data,0,0);
  *pdVar2 = obj.X - station.X;
  pdVar2 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&result.data,1,0);
  *pdVar2 = obj.Y - station.Y;
  pdVar2 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&result.data,2,0);
  *pdVar2 = obj.Z - station.Z;
  _local_b0 = Matrix<double,3,3>::operator*
                        ((Matrix<double,3,3> *)&vec.data,(Matrix<double,_3,_1> *)&result.data);
  pdVar2 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_b0,0,0);
  *(double *)station_blh.H = *pdVar2;
  pdVar2 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_b0,1,0);
  *(double *)((long)station_blh.H + 8) = *pdVar2;
  pdVar2 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_b0,2,0);
  *(double *)((long)station_blh.H + 0x10) = *pdVar2;
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&result.data);
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_b0);
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&vec.data);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool XYZ2NEU(const XYZ station, const XYZ obj, ELLIPSOID type, XYZ &neu)
{
    BLH station_blh;

    XYZ2BLH(station, type, station_blh);
    // cout << station_blh << endl;
    double B = Deg2Rad(station_blh.B);
    double L = Deg2Rad(station_blh.L);
    Matrix3d rotation;
    rotation(0, 0) = -sin(B) * cos(L);
    rotation(0, 1) = -sin(B) * sin(L);
    rotation(0, 2) = cos(B);

    rotation(1, 0) = -sin(L);
    rotation(1, 1) = cos(L);
    rotation(1, 2) = 0;

    rotation(2, 0) = cos(B) * cos(L);
    rotation(2, 1) = cos(B) * sin(L);
    rotation(2, 2) = sin(B);

    Vector3d vec;
    vec(0, 0) = obj.X - station.X;
    vec(1, 0) = obj.Y - station.Y;
    vec(2, 0) = obj.Z - station.Z;

    Vector3d result = rotation * vec;
    neu.X = result(0, 0);
    neu.Y = result(1, 0);
    neu.Z = result(2, 0);
    vec.deleteMatrix();
    result.deleteMatrix();
    rotation.deleteMatrix();
}